

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O1

void anon_unknown.dwarf_f0d44::releasePixels
               (int type,Array2D<unsigned_int_*> *uintData,Array2D<float_*> *floatData,
               Array2D<Imath_3_2::half_*> *halfData,int width,int height)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (0 < height) {
    lVar4 = 0;
    uVar2 = 0;
    do {
      if (0 < width) {
        uVar3 = 0;
        do {
          if (type == 2) {
            pvVar1 = *(void **)((long)halfData->_data + uVar3 * 8 + halfData->_sizeY * lVar4);
            if (pvVar1 != (void *)0x0) {
              operator_delete__(pvVar1);
            }
          }
          else if (type == 1) {
            pvVar1 = *(void **)((long)floatData->_data + uVar3 * 8 + floatData->_sizeY * lVar4);
            if (pvVar1 != (void *)0x0) {
              operator_delete__(pvVar1);
            }
          }
          else if ((type == 0) &&
                  (pvVar1 = *(void **)((long)uintData->_data + uVar3 * 8 + uintData->_sizeY * lVar4)
                  , pvVar1 != (void *)0x0)) {
            operator_delete__(pvVar1);
          }
          uVar3 = uVar3 + 1;
        } while ((uint)width != uVar3);
      }
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar2 != (uint)height);
  }
  return;
}

Assistant:

void
releasePixels (
    int                     type,
    Array2D<unsigned int*>& uintData,
    Array2D<float*>&        floatData,
    Array2D<half*>&         halfData,
    int                     width,
    int                     height)
{
    releasePixels (
        type, uintData, floatData, halfData, 0, width - 1, 0, height - 1);
}